

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS
ref_import_bin_ugrid_c2n(REF_CELL ref_cell,REF_INT ncell,FILE *file,REF_BOOL swap,REF_BOOL fat)

{
  int iVar1;
  uint uVar2;
  REF_INT *chunk_00;
  int local_d0;
  int local_cc;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *c2n;
  REF_INT nodes [27];
  REF_INT new_cell;
  REF_INT node;
  REF_INT cell;
  REF_INT chunk;
  REF_INT nread;
  REF_INT max_chunk;
  REF_INT node_per;
  REF_BOOL fat_local;
  REF_BOOL swap_local;
  FILE *file_local;
  REF_INT ncell_local;
  REF_CELL ref_cell_local;
  
  if (0 < ncell) {
    if (ref_cell->node_per < ref_cell->size_per) {
      nodes[(long)ref_cell->node_per + -2] = -1;
    }
    iVar1 = ref_cell->node_per;
    local_cc = ncell;
    if (1000000 < ncell) {
      local_cc = 1000000;
    }
    if (iVar1 * local_cc < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",499,
             "ref_import_bin_ugrid_c2n","malloc c2n of REF_INT negative");
      return 1;
    }
    chunk_00 = (REF_INT *)malloc((long)(iVar1 * local_cc) << 2);
    if (chunk_00 == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",499,
             "ref_import_bin_ugrid_c2n","malloc c2n of REF_INT NULL");
      return 2;
    }
    for (cell = 0; cell < ncell; cell = local_d0 + cell) {
      if (local_cc < ncell - cell) {
        local_d0 = local_cc;
      }
      else {
        local_d0 = ncell - cell;
      }
      uVar2 = ref_import_bin_ugrid_chunk(file,swap,fat,iVar1 * local_d0,chunk_00);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x1f8,"ref_import_bin_ugrid_c2n",(ulong)uVar2,"c2n");
        return uVar2;
      }
      for (new_cell = 0; new_cell < local_d0; new_cell = new_cell + 1) {
        for (nodes[0x1a] = 0; nodes[0x1a] < iVar1; nodes[0x1a] = nodes[0x1a] + 1) {
          nodes[(long)nodes[0x1a] + -2] = chunk_00[nodes[0x1a] + iVar1 * new_cell] + -1;
        }
        uVar2 = ref_cell_add(ref_cell,(REF_INT *)&c2n,nodes + 0x19);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x1fd,"ref_import_bin_ugrid_c2n",(ulong)uVar2,"new cell");
          return uVar2;
        }
        if (new_cell + cell != nodes[0x19]) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x1fe,"ref_import_bin_ugrid_c2n","cell index");
          return 1;
        }
      }
    }
    if (chunk_00 != (REF_INT *)0x0) {
      free(chunk_00);
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_import_bin_ugrid_c2n(REF_CELL ref_cell,
                                                   REF_INT ncell, FILE *file,
                                                   REF_BOOL swap,
                                                   REF_BOOL fat) {
  REF_INT node_per, max_chunk, nread, chunk, cell, node, new_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *c2n;

  if (0 < ncell) {
    /* to skip boundary tag */
    if (ref_cell_size_per(ref_cell) > ref_cell_node_per(ref_cell))
      nodes[ref_cell_node_per(ref_cell)] = REF_EMPTY;
    node_per = ref_cell_node_per(ref_cell);
    max_chunk = MIN(1000000, ncell);
    ref_malloc(c2n, node_per * max_chunk, REF_INT);
    nread = 0;
    while (nread < ncell) {
      chunk = MIN(max_chunk, ncell - nread);
      RSS(ref_import_bin_ugrid_chunk(file, swap, fat, node_per * chunk, c2n),
          "c2n");
      for (cell = 0; cell < chunk; cell++) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = c2n[node + node_per * cell] - 1;
        }
        RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new cell");
        RES(cell + nread, new_cell, "cell index");
      }
      nread += chunk;
    }
    ref_free(c2n);
  }

  return REF_SUCCESS;
}